

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O0

void Gia_Iso2ManCollectOrder_rec
               (Gia_Man_t *p,int Id,Vec_Int_t *vRoots,Vec_Int_t *vVec,Vec_Int_t *vMap)

{
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pObj;
  Vec_Int_t *vMap_local;
  Vec_Int_t *vVec_local;
  Vec_Int_t *vRoots_local;
  int Id_local;
  Gia_Man_t *p_local;
  
  iVar2 = Gia_ObjIsTravIdCurrentId(p,Id);
  if (iVar2 == 0) {
    Gia_ObjSetTravIdCurrentId(p,Id);
    pGVar3 = Gia_ManObj(p,Id);
    iVar2 = Gia_ObjIsAnd(pGVar3);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjIsCo(pGVar3);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjIsCi(pGVar3);
        if (iVar2 == 0) {
          iVar2 = Gia_ObjIsConst0(pGVar3);
          if (iVar2 == 0) {
            __assert_fail("Gia_ObjIsConst0(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIso2.c"
                          ,0x1ce,
                          "void Gia_Iso2ManCollectOrder_rec(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
        }
        else {
          iVar2 = Gia_ObjIsRo(p,pGVar3);
          if (iVar2 != 0) {
            pGVar3 = Gia_ObjRoToRi(p,pGVar3);
            iVar2 = Gia_ObjId(p,pGVar3);
            Vec_IntPush(vRoots,iVar2);
          }
        }
      }
      else {
        iVar2 = Gia_ObjFaninId0(pGVar3,Id);
        Gia_Iso2ManCollectOrder_rec(p,iVar2,vRoots,vVec,vMap);
      }
    }
    else {
      pGVar4 = Gia_ObjFanin0(pGVar3);
      uVar1 = pGVar4->Value;
      pGVar4 = Gia_ObjFanin1(pGVar3);
      if (pGVar4->Value < uVar1) {
        iVar2 = Gia_ObjFaninId1(pGVar3,Id);
        Gia_Iso2ManCollectOrder_rec(p,iVar2,vRoots,vVec,vMap);
        iVar2 = Gia_ObjFaninId0(pGVar3,Id);
        Gia_Iso2ManCollectOrder_rec(p,iVar2,vRoots,vVec,vMap);
      }
      else {
        iVar2 = Gia_ObjFaninId0(pGVar3,Id);
        Gia_Iso2ManCollectOrder_rec(p,iVar2,vRoots,vVec,vMap);
        iVar2 = Gia_ObjFaninId1(pGVar3,Id);
        Gia_Iso2ManCollectOrder_rec(p,iVar2,vRoots,vVec,vMap);
      }
    }
    iVar2 = Vec_IntSize(vVec);
    Vec_IntWriteEntry(vMap,Id,iVar2);
    Vec_IntPush(vVec,Id);
  }
  return;
}

Assistant:

void Gia_Iso2ManCollectOrder_rec( Gia_Man_t * p, int Id, Vec_Int_t * vRoots, Vec_Int_t * vVec, Vec_Int_t * vMap )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, Id) )
        return;
    Gia_ObjSetTravIdCurrentId(p, Id);
    pObj = Gia_ManObj( p, Id );
    if ( Gia_ObjIsAnd(pObj) )
    {
        if ( Gia_ObjFanin0(pObj)->Value <= Gia_ObjFanin1(pObj)->Value )
        {
            Gia_Iso2ManCollectOrder_rec( p, Gia_ObjFaninId0(pObj, Id), vRoots, vVec, vMap );
            Gia_Iso2ManCollectOrder_rec( p, Gia_ObjFaninId1(pObj, Id), vRoots, vVec, vMap );
        }
        else
        {
            Gia_Iso2ManCollectOrder_rec( p, Gia_ObjFaninId1(pObj, Id), vRoots, vVec, vMap );
            Gia_Iso2ManCollectOrder_rec( p, Gia_ObjFaninId0(pObj, Id), vRoots, vVec, vMap );
        }
    }
    else if ( Gia_ObjIsCo(pObj) )
    {
        Gia_Iso2ManCollectOrder_rec( p, Gia_ObjFaninId0(pObj, Id), vRoots, vVec, vMap );
    }
    else if ( Gia_ObjIsCi(pObj) )
    {
        if ( Gia_ObjIsRo(p, pObj) )
            Vec_IntPush( vRoots, Gia_ObjId(p, Gia_ObjRoToRi(p, pObj)) );
    }
    else assert( Gia_ObjIsConst0(pObj) );
    Vec_IntWriteEntry( vMap, Id, Vec_IntSize(vVec) );
    Vec_IntPush( vVec, Id );
}